

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<Qt::DayOfWeek>::insert
          (QPodArrayOps<Qt::DayOfWeek> *this,qsizetype i,qsizetype n,parameter_type t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  DayOfWeek *pDVar4;
  ulong uVar5;
  GrowthPosition where;
  long lVar6;
  int iVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  int iVar11;
  undefined1 auVar10 [16];
  
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<Qt::DayOfWeek>).size != 0);
  QArrayDataPointer<Qt::DayOfWeek>::detachAndGrow
            (&this->super_QArrayDataPointer<Qt::DayOfWeek>,where,n,(DayOfWeek **)0x0,
             (QArrayDataPointer<Qt::DayOfWeek> *)0x0);
  pDVar4 = createHole(this,where,i,n);
  auVar3 = _DAT_004c9270;
  auVar2 = _DAT_004c9260;
  auVar1 = _DAT_004c80d0;
  if (n != 0) {
    lVar6 = n + -1;
    auVar7._8_4_ = (int)lVar6;
    auVar7._0_8_ = lVar6;
    auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar5 = 0;
    auVar7 = auVar7 ^ _DAT_004c80d0;
    do {
      auVar9._8_4_ = (int)uVar5;
      auVar9._0_8_ = uVar5;
      auVar9._12_4_ = (int)(uVar5 >> 0x20);
      auVar10 = (auVar9 | auVar3) ^ auVar1;
      iVar8 = auVar7._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar8 && auVar7._0_4_ < auVar10._0_4_ || iVar8 < auVar10._4_4_)
                & 1)) {
        pDVar4[uVar5] = t;
      }
      if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
          auVar10._12_4_ <= auVar7._12_4_) {
        pDVar4[uVar5 + 1] = t;
      }
      auVar9 = (auVar9 | auVar2) ^ auVar1;
      iVar11 = auVar9._4_4_;
      if (iVar11 <= iVar8 && (iVar11 != iVar8 || auVar9._0_4_ <= auVar7._0_4_)) {
        pDVar4[uVar5 + 2] = t;
        pDVar4[uVar5 + 3] = t;
      }
      uVar5 = uVar5 + 4;
    } while ((n + 3U & 0xfffffffffffffffc) != uVar5);
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }